

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.h
# Opt level: O3

int exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
              (long seed,long pdf_first,long pdf_last,int *chosen_index)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  uVar4 = *(ulong *)(pdf_first + 8);
  uVar3 = *(ulong *)(pdf_last + 8);
  if (uVar3 <= uVar4) {
    return 1;
  }
  fVar5 = 0.0;
  do {
    fVar6 = *(float *)(uVar4 + 4);
    if (fVar6 < 0.0) {
      *(undefined4 *)(uVar4 + 4) = 0;
      uVar3 = *(ulong *)(pdf_last + 8);
      fVar6 = 0.0;
    }
    fVar5 = fVar5 + fVar6;
    uVar4 = uVar4 + 8;
  } while (uVar4 != uVar3);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    uVar4 = *(ulong *)(pdf_first + 8);
    if (uVar4 == uVar3) {
      iVar2 = -1;
    }
    else {
      fVar7 = ((float)((uint)(seed * 0x66d5deece66d + 0x7fffffffU >> 0x19) & 0x7fffff | 0x3f800000)
              + -1.0) * fVar5;
      fVar6 = fVar5;
      if (fVar7 <= fVar5) {
        fVar6 = fVar7;
      }
      fVar7 = 0.0;
      iVar2 = -1;
      bVar1 = false;
      do {
        iVar2 = iVar2 + 1;
        fVar8 = *(float *)(uVar4 + 4);
        fVar7 = fVar7 + fVar8;
        if ((!bVar1) && (fVar6 < fVar7)) {
          *chosen_index = iVar2;
          fVar8 = *(float *)(uVar4 + 4);
          bVar1 = true;
        }
        *(float *)(uVar4 + 4) = fVar8 / fVar5;
        uVar4 = uVar4 + 8;
      } while (uVar4 != *(ulong *)(pdf_last + 8));
      if (bVar1) {
        return 0;
      }
    }
    *chosen_index = iVar2;
  }
  else {
    *chosen_index = 0;
    *(undefined4 *)(*(long *)(pdf_first + 8) + 4) = 0x3f800000;
  }
  return 0;
}

Assistant:

bool operator!=(const score_iterator& other) const { return _p != other._p; }